

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planets.cpp
# Opt level: O1

void __thiscall Planets::LoadPlanets(Planets *this,string *filename)

{
  pointer pcVar1;
  _Rb_tree_node_base *p_Var2;
  element_type *peVar3;
  pointer pbVar4;
  int x;
  int y;
  int z;
  long *plVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  string *filename_00;
  string planet_name;
  shared_ptr<Planet> planet;
  shared_ptr<Node> planet_node;
  string coords;
  string planet_id;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>
  child;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coords_list;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  children;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  shared_ptr<Planet> local_1e8;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  element_type *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_node_base *local_1a0;
  _Base_ptr local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  local_60;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_1a8 = (_Base_ptr)this;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + filename->_M_string_length);
  SkexmlParser::Parse((SkexmlParser *)&local_198,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
              *)&local_198->_M_left);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>
      ::pair(&local_108,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>
              *)(p_Var6 + 1));
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_1a0 = p_Var6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_108.first._M_dataplus._M_p,
                 local_108.first._M_dataplus._M_p + local_108.first._M_string_length);
      peVar3 = local_108.second.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"ID","");
      Node::GetAttribute(&local_128,peVar3,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      peVar3 = local_108.second.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Coordinates","");
      Node::GetAttribute(&local_188,peVar3,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      Tokenizer::GetAllTokens(&local_d8,&local_a0,',');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      x = atoi(local_128._M_dataplus._M_p);
      std::operator+(&local_c0,&GameData::PLANET_PATH_abi_cxx11_,&local_208);
      filename_00 = (string *)0x1701b1;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
      pbVar4 = local_d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_1c8 = *plVar7;
        lStack_1c0 = plVar5[3];
        local_1d8 = &local_1c8;
      }
      else {
        local_1c8 = *plVar7;
        local_1d8 = (long *)*plVar5;
      }
      local_1d0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      y = atoi(((local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      z = atoi(pbVar4[1]._M_dataplus._M_p);
      atoi(pbVar4[2]._M_dataplus._M_p);
      BuildPlanet((Planets *)&local_1b8,filename_00,(int)&local_1d8,x,y,z);
      p_Var2 = local_1a0;
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      local_1e8.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1b8;
      local_1e8.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_1b0
      ;
      if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
        }
      }
      AddPlanet((Planets *)local_1a8,&local_1e8);
      if (local_1e8.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e8.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if (local_108.second.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.second.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.first._M_dataplus._M_p != &local_108.first.field_2) {
        operator_delete(local_108.first._M_dataplus._M_p);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
  }
  return;
}

Assistant:

void Planets::LoadPlanets(std::string filename) {
    std::shared_ptr<Node> planet_node = SkexmlParser::Parse(filename);
    auto children = planet_node->GetChildren();
    for(auto child : children)
    {
        std::string planet_name = child.first;
        std::string planet_id = child.second->GetAttribute("ID");
        std::string coords = child.second->GetAttribute("Coordinates");
        auto coords_list = Tokenizer::GetAllTokens(coords, ',');
        int id = atoi(planet_id.c_str());
        std::shared_ptr<Planet> planet = BuildPlanet(GameData::PLANET_PATH + planet_name + ".sml", id,
                                                     atoi(coords_list[0].c_str()),
                                                     atoi(coords_list[1].c_str()),
                                                     atoi(coords_list[2].c_str()));

        AddPlanet(planet);
    }
}